

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O1

Error __thiscall miniros::MasterLink::initParam(MasterLink *this,M_string *remappings)

{
  int iVar1;
  char *pcVar2;
  RPCManager *this_00;
  long *plVar3;
  int *piVar4;
  long lVar5;
  _Base_ptr p_Var6;
  undefined8 uVar7;
  socklen_t __len;
  size_type *in_RCX;
  string local_name;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  MasterLink *local_68;
  string local_58;
  _Base_ptr local_38;
  
  __len = (socklen_t)in_RCX;
  p_Var6 = (remappings->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_68 = this;
  do {
    if ((_Rb_tree_header *)p_Var6 == &(remappings->_M_t)._M_impl.super__Rb_tree_header) {
      this_00 = (local_68->internal_->rpcManager).
                super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (this_00 != (RPCManager *)0x0) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"paramUpdate","");
        local_88._8_8_ = 0;
        local_88._0_8_ = local_68;
        local_78._8_8_ =
             std::
             _Function_handler<void_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp:1043:7)>
             ::_M_invoke;
        local_78._0_8_ =
             std::
             _Function_handler<void_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp:1043:7)>
             ::_M_manager;
        RPCManager::bind(this_00,(int)&local_58,(sockaddr *)local_88,__len);
        if ((code *)local_78._0_8_ != (code *)0x0) {
          (*(code *)local_78._0_8_)(local_88,local_88,3);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
      return (Error)Ok;
    }
    if ((_Base_ptr)0x1 < p_Var6[1]._M_parent) {
      pcVar2 = *(char **)(p_Var6 + 1);
      if ((*pcVar2 == '_') && (pcVar2[1] != '_')) {
        std::__cxx11::string::substr((ulong)local_88,(ulong)(p_Var6 + 1));
        plVar3 = (long *)std::__cxx11::string::replace((ulong)local_88,0,(char *)0x0,0x25d851);
        in_RCX = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_RCX) {
          local_58.field_2._M_allocated_capacity = *in_RCX;
          local_58.field_2._8_8_ = plVar3[3];
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        }
        else {
          local_58.field_2._M_allocated_capacity = *in_RCX;
          local_58._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_58._M_string_length = plVar3[1];
        *plVar3 = (long)in_RCX;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if ((undefined1 *)local_88._0_8_ != local_78) {
          operator_delete((void *)local_88._0_8_,local_78._0_8_ + 1);
        }
        local_38 = p_Var6 + 2;
        pcVar2 = *(char **)local_38;
        piVar4 = __errno_location();
        iVar1 = *piVar4;
        *piVar4 = 0;
        lVar5 = strtol(pcVar2,(char **)local_88,10);
        if ((char *)local_88._0_8_ == pcVar2) {
          uVar7 = std::__throw_invalid_argument("stoi");
LAB_001e19a2:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          _Unwind_Resume(uVar7);
        }
        if (((int)lVar5 != lVar5) || (*piVar4 == 0x22)) {
          uVar7 = std::__throw_out_of_range("stoi");
          goto LAB_001e19a2;
        }
        if (*piVar4 == 0) {
          *piVar4 = iVar1;
        }
        names::resolve((string *)local_88,&local_58,true);
        set(local_68,(string *)local_88,(int)lVar5);
        if ((undefined1 *)local_88._0_8_ != local_78) {
          operator_delete((void *)local_88._0_8_,local_78._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
    }
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6);
    __len = (socklen_t)in_RCX;
  } while( true );
}

Assistant:

Error MasterLink::initParam(const M_string& remappings)
{
  auto it = remappings.begin();
  auto end = remappings.end();
  for (; it != end; ++it) {
    const std::string& name = it->first;
    const std::string& param = it->second;

    if (name.size() < 2) {
      continue;
    }

    if (name[0] == '_' && name[1] != '_') {
      std::string local_name = "~" + name.substr(1);

      bool success = false;

      try {
        auto i = std::stoi(param);
        this->set(names::resolve(local_name), i);
        success = true;
      } catch (std::invalid_argument&) {
      } catch (std::out_of_range&) {
      }

      if (success) {
        continue;
      }

      try {
        double d = std::stod(param);
        this->set(names::resolve(local_name), d);
        success = true;
      } catch (std::invalid_argument&) {
      } catch (std::out_of_range&) {
      }

      if (success) {
        continue;
      }

      if (param == "true" || param == "True" || param == "TRUE") {
        this->set(names::resolve(local_name), true);
      } else if (param == "false" || param == "False" || param == "FALSE") {
        this->set(names::resolve(local_name), false);
      } else {
        this->set(names::resolve(local_name), param);
      }
    }
  }

  if (internal_->rpcManager) {
    internal_->rpcManager->bind("paramUpdate",
      [this](const RpcValue& params, RpcValue& result) {
        return paramUpdateCallback(params, result);
      });
  }
  return Error::Ok;
}